

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::destroy_pipeline(InnerProduct *this,Option *opt)

{
  size_type sVar1;
  reference ppLVar2;
  void *in_RSI;
  long in_RDI;
  int i;
  Option opt_cpu;
  int local_3c;
  undefined1 local_38 [24];
  undefined1 local_20;
  
  memcpy(local_38,in_RSI,0x28);
  local_20 = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x28))(*(long **)(in_RDI + 0x1a0),local_38);
    if (*(long **)(in_RDI + 0x1a0) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
  }
  local_3c = 0;
  while( true ) {
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8));
    if ((int)sVar1 <= local_3c) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8),
                         (long)local_3c);
    (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,local_38);
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x1a8),
                         (long)local_3c);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    local_3c = local_3c + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x16009b);
  return 0;
}

Assistant:

int InnerProduct::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (quantize)
    {
        quantize->destroy_pipeline(opt_cpu);
        delete quantize;
        quantize = 0;
    }

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt_cpu);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    return 0;
}